

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
before_value(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint8_t code)

{
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  size_t __n;
  reference pvVar4;
  iterator __position;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  value_type in_SIL;
  allocator<char> *in_RDI;
  string name;
  string *in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  *in_stack_ffffffffffffff30;
  value_type_conflict *in_stack_ffffffffffffff38;
  vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_45;
  value_type local_9;
  
  local_9 = in_SIL;
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ::empty(in_stack_ffffffffffffff40);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             ::back(in_stack_ffffffffffffff30);
    bVar1 = stack_item::is_object(pvVar3);
    if (bVar1) {
      in_RDI = in_RDI + 0x78;
      pvVar3 = std::
               vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
               ::back(in_stack_ffffffffffffff30);
      __n = stack_item::member_offset(pvVar3);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,__n);
      *pvVar4 = local_9;
    }
    else {
      in_RDI = in_RDI + 0x78;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      pvVar3 = std::
               vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
               ::back((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                       *)in_RDI);
      stack_item::next_index(pvVar3);
      this_00 = &local_68;
      std::__cxx11::to_string(CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      __position = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_RDI,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this_00);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff70,
                 (const_iterator)__position._M_current,__first,__last);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                 (value_type_conflict *)this_00);
      std::__cxx11::string::~string((string *)&local_68);
    }
    return;
  }
  local_45 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RDI);
  assertion_error::assertion_error
            ((assertion_error *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_45 = 0;
  __cxa_throw(uVar2,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

void before_value(uint8_t code) 
    {
        JSONCONS_ASSERT(!stack_.empty());
        if (stack_.back().is_object())
        {
            buffer_[stack_.back().member_offset()] = code;
        }
        else
        {
            buffer_.push_back(code);
            std::string name = std::to_string(stack_.back().next_index());
            buffer_.insert(buffer_.end(), name.begin(), name.end());
            buffer_.push_back(0x00);
        }
    }